

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_File_Chooser2.cxx
# Opt level: O3

void __thiscall Fl_File_Chooser::rescan(Fl_File_Chooser *this)

{
  size_t sVar1;
  char pathname [2048];
  undefined8 uStack_820;
  char local_818 [2048];
  
  uStack_820 = 0x1ffcbe;
  fl_strlcpy(local_818,this->directory_,0x800);
  if (local_818[0] != '\0') {
    uStack_820 = 0x1ffccc;
    sVar1 = strlen(local_818);
    if (local_818[sVar1 - 1] != '/') {
      uStack_820 = 0x1ffce8;
      fl_strlcat(local_818,"/",0x800);
    }
  }
  uStack_820 = 0x1ffcf7;
  Fl_File_Input::value(this->fileName,local_818);
  if ((this->type_ & 4) == 0) {
    uStack_820 = 0x1ffd0c;
    Fl_Widget::deactivate((Fl_Widget *)this->okButton);
  }
  else {
    uStack_820 = 0x1ffd13;
    Fl_Widget::activate((Fl_Widget *)this->okButton);
  }
  uStack_820 = 0x1ffd29;
  Fl_File_Browser::load(this->fileList,this->directory_,sort);
  if ((this->showHiddenButton->super_Fl_Light_Button).super_Fl_Button.value_ == '\0') {
    uStack_820 = 0x1ffd3e;
    remove_hidden_files(this);
  }
  uStack_820 = 0x1ffd46;
  update_preview(this);
  return;
}

Assistant:

void
Fl_File_Chooser::rescan()
{
  char	pathname[FL_PATH_MAX];		// New pathname for filename field


  // Clear the current filename
  strlcpy(pathname, directory_, sizeof(pathname));
  if (pathname[0] && pathname[strlen(pathname) - 1] != '/') {
    strlcat(pathname, "/", sizeof(pathname));
  }
//  puts("Setting fileName in rescan()");
  fileName->value(pathname);

  if (type_ & DIRECTORY)
    okButton->activate();
  else
    okButton->deactivate();

  // Build the file list...
  fileList->load(directory_, sort);
#ifndef WIN32	
  if (!showHiddenButton->value()) remove_hidden_files();
#endif
  // Update the preview box...
  update_preview();
}